

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_internal_entry.h
# Opt level: O0

void __thiscall ParallelManager::term(ParallelManager *this,function<void_()> *term_func)

{
  mutex_type *in_RSI;
  function<void_()> *in_RDI;
  lock_guard<std::mutex> lck;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,in_RSI);
  if ((in_RDI[1].super__Function_base._M_functor._M_pod_data[10] & 1U) == 0) {
    std::function<void_()>::operator()(in_RDI);
    in_RDI[1].super__Function_base._M_functor._M_pod_data[10] = '\x01';
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x54c0eb);
  return;
}

Assistant:

void term(std::function<void(void)> term_func)
	{
		std::lock_guard<std::mutex> lck(m_lock);
		if (!m_term_done)
		{
			term_func();
			m_term_done = true;
		}
	}